

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_BOOL opj_tcd_copy_tile_data(opj_tcd_t *p_tcd,OPJ_BYTE *p_src,OPJ_SIZE_T p_src_length)

{
  ushort uVar1;
  OPJ_INT32 OVar2;
  opj_image_t *poVar3;
  OPJ_INT32 *pOVar4;
  OPJ_BOOL OVar5;
  OPJ_SIZE_T OVar6;
  opj_tcd_tilecomp_t *poVar7;
  OPJ_INT32 *l_src_ptr;
  opj_image_comp_t *poVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  OVar6 = opj_tcd_get_encoded_tile_size(p_tcd);
  OVar5 = 0;
  if (OVar6 == p_src_length) {
    poVar3 = p_tcd->image;
    poVar7 = p_tcd->tcd_image->tiles->comps;
    poVar8 = poVar3->comps;
    OVar5 = 1;
    for (uVar9 = 0; uVar9 < poVar3->numcomps; uVar9 = uVar9 + 1) {
      lVar10 = (long)(poVar7->y1 - poVar7->y0) * (long)(poVar7->x1 - poVar7->x0);
      iVar11 = ((poVar8->prec >> 3) + 1) - (uint)((poVar8->prec & 7) == 0);
      if (iVar11 == 3) {
        iVar11 = 4;
      }
      if (iVar11 == 4) {
        pOVar4 = poVar7->data;
        for (lVar12 = 0; lVar10 - lVar12 != 0; lVar12 = lVar12 + 1) {
          OVar2 = *(OPJ_INT32 *)p_src;
          p_src = (OPJ_BYTE *)((long)p_src + 4);
          pOVar4[lVar12] = OVar2;
        }
      }
      else if (iVar11 == 2) {
        pOVar4 = poVar7->data;
        if (poVar8->sgnd == 0) {
          for (lVar12 = 0; lVar10 - lVar12 != 0; lVar12 = lVar12 + 1) {
            uVar1 = *(ushort *)p_src;
            p_src = (OPJ_BYTE *)((long)p_src + 2);
            pOVar4[lVar12] = (uint)uVar1;
          }
        }
        else {
          for (lVar12 = 0; lVar10 - lVar12 != 0; lVar12 = lVar12 + 1) {
            uVar1 = *(ushort *)p_src;
            p_src = (OPJ_BYTE *)((long)p_src + 2);
            pOVar4[lVar12] = (int)(short)uVar1;
          }
        }
      }
      else if (iVar11 == 1) {
        pOVar4 = poVar7->data;
        if (poVar8->sgnd == 0) {
          for (lVar12 = 0; lVar10 - lVar12 != 0; lVar12 = lVar12 + 1) {
            pOVar4[lVar12] = (uint)*(byte *)((long)p_src + lVar12);
          }
        }
        else {
          for (lVar12 = 0; lVar10 - lVar12 != 0; lVar12 = lVar12 + 1) {
            pOVar4[lVar12] = (int)*(char *)((long)p_src + lVar12);
          }
        }
        p_src = (OPJ_BYTE *)((long)p_src + lVar12);
      }
      poVar8 = poVar8 + 1;
      poVar7 = poVar7 + 1;
    }
  }
  return OVar5;
}

Assistant:

OPJ_BOOL opj_tcd_copy_tile_data(opj_tcd_t *p_tcd,
                                OPJ_BYTE * p_src,
                                OPJ_SIZE_T p_src_length)
{
    OPJ_UINT32 i;
    OPJ_SIZE_T j;
    OPJ_SIZE_T l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_SIZE_T l_nb_elem;

    l_data_size = opj_tcd_get_encoded_tile_size(p_tcd);
    if (l_data_size != p_src_length) {
        return OPJ_FALSE;
    }

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;
    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */
        l_nb_elem = (OPJ_SIZE_T)(l_tilec->x1 - l_tilec->x0) *
                    (OPJ_SIZE_T)(l_tilec->y1 - l_tilec->y0);

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        switch (l_size_comp) {
        case 1: {
            OPJ_CHAR * l_src_ptr = (OPJ_CHAR *) p_src;
            OPJ_INT32 * l_dest_ptr = l_tilec->data;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
                }
            } else {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (*(l_src_ptr++)) & 0xff;
                }
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        case 2: {
            OPJ_INT32 * l_dest_ptr = l_tilec->data;
            OPJ_INT16 * l_src_ptr = (OPJ_INT16 *) p_src;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
                }
            } else {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (*(l_src_ptr++)) & 0xffff;
                }
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        case 4: {
            OPJ_INT32 * l_src_ptr = (OPJ_INT32 *) p_src;
            OPJ_INT32 * l_dest_ptr = l_tilec->data;

            for (j = 0; j < l_nb_elem; ++j) {
                *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        }

        ++l_img_comp;
        ++l_tilec;
    }

    return OPJ_TRUE;
}